

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  WorkingMode WVar3;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  ostream *poVar7;
  cmState *this_00;
  pointer pcVar8;
  cmake *pcVar9;
  allocator<char> local_469;
  undefined1 local_468 [8];
  string error_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  undefined1 local_400 [8];
  string error;
  bool hadNestedError;
  bool invokeSucceeded;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> pcmd;
  cmCommand *proto;
  string local_3c0;
  undefined1 local_3a0 [8];
  ostringstream e;
  int local_228;
  allocator<char> local_221;
  int d;
  istringstream local_200 [8];
  istringstream s;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  char *depthStr;
  int depth;
  cmMakefileCall stack_manager;
  bool result;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  stack_manager.Makefile._7_1_ = 1;
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    this_local._7_1_ = (bool)(stack_manager.Makefile._7_1_ & 1);
  }
  else {
    cmMakefileCall::cmMakefileCall
              ((cmMakefileCall *)&stack0xffffffffffffffc8,this,&lff->super_cmCommandContext,status);
    depthStr._4_4_ = 1000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_69);
    pcVar5 = GetDefinition(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    local_48 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&d,pcVar5,&local_221);
      std::__cxx11::istringstream::istringstream(local_200,(string *)&d,_S_in);
      std::__cxx11::string::~string((string *)&d);
      std::allocator<char>::~allocator(&local_221);
      plVar6 = (long *)std::istream::operator>>(local_200,&local_228);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if (bVar1) {
        depthStr._4_4_ = local_228;
      }
      std::__cxx11::istringstream::~istringstream(local_200);
    }
    if (depthStr._4_4_ < this->RecursionDepth) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
      poVar7 = std::operator<<((ostream *)local_3a0,"Maximum recursion depth of ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,depthStr._4_4_);
      std::operator<<(poVar7," exceeded");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
    }
    else {
      this_00 = GetState(this);
      pcmd._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
      super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
           cmState::GetCommandByExactName(this_00,(string *)lff);
      if ((tuple<cmCommand_*,_std::default_delete<cmCommand>_>)
          pcmd._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
          super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
          super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl ==
          (_Head_base<0UL,_cmCommand_*,_false>)0x0) {
        bVar1 = cmSystemTools::GetFatalErrorOccured();
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,"Unknown CMake command \"",&local_469);
          std::allocator<char>::~allocator(&local_469);
          std::__cxx11::string::operator+=
                    ((string *)local_468,(string *)&(lff->super_cmCommandContext).Name.Original);
          std::__cxx11::string::operator+=((string *)local_468,"\".");
          IssueMessage(this,FATAL_ERROR,(string *)local_468);
          stack_manager.Makefile._7_1_ = 0;
          cmSystemTools::SetFatalErrorOccured();
          std::__cxx11::string::~string((string *)local_468);
        }
      }
      else {
        pcVar8 = (pointer)(**(code **)(*(long *)pcmd._M_t.
                                                super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>
                                                .super__Head_base<0UL,_cmCommand_*,_false>.
                                                _M_head_impl + 0x30))();
        std::unique_ptr<cmCommand,std::default_delete<cmCommand>>::
        unique_ptr<std::default_delete<cmCommand>,void>
                  ((unique_ptr<cmCommand,std::default_delete<cmCommand>> *)&stack0xfffffffffffffc28,
                   pcVar8);
        pcVar8 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->
                           ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                            &stack0xfffffffffffffc28);
        cmCommand::SetMakefile(pcVar8,this);
        bVar1 = cmSystemTools::GetFatalErrorOccured();
        if (!bVar1) {
          pcVar9 = GetCMakeInstance(this);
          bVar1 = cmake::GetTrace(pcVar9);
          if (bVar1) {
            PrintCommandTrace(this,lff);
          }
          pcVar8 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->
                             ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                              &stack0xfffffffffffffc28);
          iVar2 = (*pcVar8->_vptr_cmCommand[2])(pcVar8,&lff->Arguments,status);
          error.field_2._M_local_buf[0xf] = (byte)iVar2 & 1;
          error.field_2._M_local_buf[0xe] = cmExecutionStatus::GetNestedError(status);
          if (((error.field_2._M_local_buf[0xf] & 1U) == 0) ||
             ((bool)error.field_2._M_local_buf[0xe])) {
            if (!(bool)error.field_2._M_local_buf[0xe]) {
              std::__cxx11::string::string
                        ((string *)&local_440,(string *)&(lff->super_cmCommandContext).Name.Original
                        );
              std::operator+(&local_420,&local_440," ");
              pcVar8 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->
                                 ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                                  &stack0xfffffffffffffc28);
              pcVar5 = cmCommand::GetError(pcVar8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_400,&local_420,pcVar5);
              std::__cxx11::string::~string((string *)&local_420);
              std::__cxx11::string::~string((string *)&local_440);
              IssueMessage(this,FATAL_ERROR,(string *)local_400);
              std::__cxx11::string::~string((string *)local_400);
            }
            stack_manager.Makefile._7_1_ = 0;
            pcVar9 = GetCMakeInstance(this);
            WVar3 = cmake::GetWorkingMode(pcVar9);
            if (WVar3 != NORMAL_MODE) {
              cmSystemTools::SetFatalErrorOccured();
            }
          }
          else {
            pcVar8 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->
                               ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                                &stack0xfffffffffffffc28);
            uVar4 = (*pcVar8->_vptr_cmCommand[5])();
            if ((uVar4 & 1) != 0) {
              error_1.field_2._8_8_ =
                   std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::release
                             ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                              &stack0xfffffffffffffc28);
              std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back
                        (&this->FinalPassCommands,(value_type *)((long)&error_1.field_2 + 8));
            }
          }
        }
        std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::~unique_ptr
                  ((unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)
                   &stack0xfffffffffffffc28);
      }
      this_local._7_1_ = (bool)(stack_manager.Makefile._7_1_ & 1);
    }
    cmMakefileCall::~cmMakefileCall((cmMakefileCall *)&stack0xffffffffffffffc8);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  const char* depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Lookup the command prototype.
  if (cmCommand* proto =
        this->GetState()->GetCommandByExactName(lff.Name.Lower)) {
    // Clone the prototype.
    std::unique_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }
      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.Name.Original) + " " + pcmd->GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name.Original;
      error += "\".";
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}